

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

void __thiscall
Gluco::Clause::Clause<Gluco::Clause>(Clause *this,Clause *ps,bool use_extra,bool learnt)

{
  uint uVar1;
  int iVar2;
  Lit LVar3;
  int local_20;
  int i;
  bool learnt_local;
  bool use_extra_local;
  Clause *ps_local;
  Clause *this_local;
  
  *(ulong *)&this->header = *(ulong *)&this->header & 0xfffffffffffffffc;
  *(ulong *)&this->header = *(ulong *)&this->header & 0xfffffffffffffffb | (ulong)learnt << 2;
  *(ulong *)&this->header = *(ulong *)&this->header & 0xfffffffffffffff7 | (ulong)use_extra << 3;
  *(ulong *)&this->header = *(ulong *)&this->header & 0xffffffffffffffef;
  uVar1 = size(ps);
  *(ulong *)&this->header = *(ulong *)&this->header & 0xffffffff | (ulong)uVar1 << 0x20;
  *(ulong *)&this->header = *(ulong *)&this->header & 0xffffffff8000001f;
  *(ulong *)&this->header = *(ulong *)&this->header & 0xffffffff7fffffff | 0x80000000;
  for (local_20 = 0; iVar2 = size(ps), local_20 < iVar2; local_20 = local_20 + 1) {
    LVar3 = operator[](ps,local_20);
    *(int *)(&this[1].header.field_0x0 + (long)local_20 * 4) = LVar3.x;
  }
  if ((*(ulong *)&this->header >> 3 & 1) != 0) {
    if ((*(ulong *)&this->header >> 2 & 1) == 0) {
      calcAbstraction(this);
    }
    else {
      *(undefined4 *)(&this[1].header.field_0x0 + (*(ulong *)&this->header >> 0x20) * 4) = 0;
    }
  }
  return;
}

Assistant:

Clause(const V& ps, bool use_extra, bool learnt) {
        header.mark      = 0;
        header.learnt    = learnt;
        header.has_extra = use_extra;
        header.reloced   = 0;
        header.size      = ps.size();
    header.lbd = 0;
    header.canbedel = 1;
        for (int i = 0; i < ps.size(); i++) 
            data[i].lit = ps[i];
    
        if (header.has_extra){
      if (header.learnt) 
                data[header.size].act = 0; 
            else 
                calcAbstraction(); }
    }